

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O1

double __thiscall
soplex::SPxScaler<double>::maxRowRatio(SPxScaler<double> *this,SPxLPBase<double> *lp)

{
  double dVar1;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  double dVar2;
  double *pdVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  Item *pIVar7;
  Real RVar8;
  double dVar9;
  double dVar10;
  double local_78;
  double local_70;
  double local_68;
  
  if ((lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum < 1) {
    local_78 = 0.0;
  }
  else {
    pdVar3 = (double *)__tls_get_addr(&PTR_003b6b60);
    dVar1 = *pdVar3;
    local_78 = 0.0;
    lVar6 = 0;
    do {
      pIVar7 = (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.theitem +
               (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thekey[lVar6].idx;
      ::soplex::infinity::__tls_init();
      local_68 = dVar1;
      if ((pIVar7->data).super_SVectorBase<double>.memused < 1) {
        local_70 = 0.0;
      }
      else {
        local_70 = 0.0;
        lVar4 = 0;
        lVar5 = 0;
        do {
          dVar10 = *(double *)
                    ((long)&((pIVar7->data).super_SVectorBase<double>.m_elem)->val + lVar4);
          this_00 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          this_01 = (this->_tolerances).
                    super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                    _M_pi;
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              this_01->_M_use_count = this_01->_M_use_count + 1;
              UNLOCK();
            }
            else {
              this_01->_M_use_count = this_01->_M_use_count + 1;
            }
          }
          RVar8 = Tolerances::epsilon(this_00);
          if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
          }
          dVar10 = ABS(dVar10);
          dVar2 = local_70;
          if (RVar8 < dVar10) {
            dVar9 = dVar10;
            if (local_68 <= dVar10) {
              dVar9 = local_68;
            }
            dVar2 = dVar10;
            local_68 = dVar9;
            if (dVar10 <= local_70) {
              dVar2 = local_70;
            }
          }
          local_70 = dVar2;
          lVar5 = lVar5 + 1;
          lVar4 = lVar4 + 0x10;
        } while (lVar5 < (pIVar7->data).super_SVectorBase<double>.memused);
      }
      ::soplex::infinity::__tls_init();
      if (((local_68 != dVar1) || (dVar10 = local_78, NAN(local_68) || NAN(dVar1))) &&
         (dVar10 = local_70 / local_68, local_70 / local_68 <= local_78)) {
        dVar10 = local_78;
      }
      local_78 = dVar10;
      lVar6 = lVar6 + 1;
    } while (lVar6 < (lp->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
  }
  return local_78;
}

Assistant:

R SPxScaler<R>::maxRowRatio(const SPxLPBase<R>& lp) const
{

   R pmax = 0.0;

   for(int i = 0; i < lp.nRows(); ++i)
   {
      const SVectorBase<R>& vec  = lp.rowVector(i);
      R           mini = R(infinity);
      R           maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         R x = spxAbs(vec.value(j));

         if(isZero(x, this->tolerances()->epsilon()))
            continue;

         if(x < mini)
            mini = x;

         if(x > maxi)
            maxi = x;
      }

      if(mini == R(infinity))
         continue;

      R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}